

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseAllSettledResolveOrRejectElementFunction::MarkVisitKindSpecificPtrs
          (JavascriptPromiseAllSettledResolveOrRejectElementFunction *this,
          SnapshotExtractor *extractor)

{
  JavascriptPromiseCapability **ppJVar1;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper **ppJVar2;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper **ppJVar3;
  JavascriptArray **ppJVar4;
  JavascriptPromiseCapability *this_00;
  SnapshotExtractor *extractor_local;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *this_local;
  
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromiseCapability__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptPromiseAllResolveElementFunction).capabilities);
  if (*ppJVar1 != (JavascriptPromiseCapability *)0x0) {
    ppJVar2 = Memory::WriteBarrierPtr::
              operator_cast_to_JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper__
                        ((WriteBarrierPtr *)
                         &(this->super_JavascriptPromiseAllResolveElementFunction).
                          remainingElementsWrapper);
    if (*ppJVar2 != (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)0x0) {
      ppJVar3 = Memory::WriteBarrierPtr::
                operator_cast_to_JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper__
                          ((WriteBarrierPtr *)&this->alreadyCalledWrapper);
      if (*ppJVar3 != (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)0x0) {
        ppJVar4 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptArray__
                            ((WriteBarrierPtr *)
                             &(this->super_JavascriptPromiseAllResolveElementFunction).values);
        if (*ppJVar4 != (JavascriptArray *)0x0) {
          this_00 = Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::operator->
                              (&(this->super_JavascriptPromiseAllResolveElementFunction).
                                capabilities);
          JavascriptPromiseCapability::MarkVisitPtrs(this_00,extractor);
          ppJVar4 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptArray__
                              ((WriteBarrierPtr *)
                               &(this->super_JavascriptPromiseAllResolveElementFunction).values);
          TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppJVar4);
          return;
        }
      }
    }
  }
  TTDAbort_unrecoverable_error("Don\'t think these can be null");
}

Assistant:

void JavascriptPromiseAllSettledResolveOrRejectElementFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->capabilities != nullptr && this->remainingElementsWrapper != nullptr && this->alreadyCalledWrapper != nullptr && this->values != nullptr, "Don't think these can be null");

        this->capabilities->MarkVisitPtrs(extractor);
        extractor->MarkVisitVar(this->values);
    }